

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcpLight.c
# Opt level: O0

void XcpLight_processCommand(XcpLightMessage_t *msg)

{
  _Bool local_19;
  _Bool send_flag;
  XcpLightMessage_t *reply_msg;
  XcpLightMessage_t *msg_local;
  
  XcpLight_self.cto_cmd_msg.length = msg->length;
  XcpLight_self.cto_cmd_msg.payload[0] = msg->payload[0];
  XcpLight_self.cto_cmd_msg.payload[1] = msg->payload[1];
  XcpLight_self.cto_cmd_msg.payload[2] = msg->payload[2];
  XcpLight_self.cto_cmd_msg.payload[3] = msg->payload[3];
  XcpLight_self.cto_cmd_msg.payload._4_4_ = *(undefined4 *)(msg->payload + 4);
  local_19 = false;
  XcpLight_self.current_command = msg->payload[0];
  if (XcpLight_self.current_command == 0xff) {
    local_19 = cmdConnect(msg,&XcpLight_self.cto_reply_msg);
  }
  else if ((XcpLight_self.session_status & 2) != 0) {
    switch(XcpLight_self.current_command) {
    case 0xea:
    case 0xeb:
    default:
      local_19 = buildErrorMessage(&XcpLight_self.cto_reply_msg,' ');
      break;
    case 0xf0:
      local_19 = cmdDownload(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xf1:
      local_19 = cmdUserCmd(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xf3:
      local_19 = buildErrorMessage(&XcpLight_self.cto_reply_msg,' ');
      break;
    case 0xf4:
      local_19 = cmdShortUpload(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xf5:
      local_19 = cmdUpload(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xf6:
      local_19 = cmdSetMta(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xf7:
      local_19 = cmdUnlock(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xf8:
      local_19 = cmdGetSeed(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xfb:
      local_19 = cmdGetCommModeInfo(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xfc:
      local_19 = cmdSynch(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xfd:
      local_19 = cmdGetStatus(msg,&XcpLight_self.cto_reply_msg);
      break;
    case 0xfe:
      local_19 = cmdDisconnect(msg,&XcpLight_self.cto_reply_msg);
    }
  }
  if (local_19 == true) {
    XcpLightCfg_sendMessage(&XcpLight_self.cto_reply_msg);
  }
  return;
}

Assistant:

void XcpLight_processCommand(XcpLightMessage_t *msg)
{
  XcpLightMessage_t *reply_msg = &(XcpLight_self.cto_reply_msg);

#ifdef XCPLIGHT_CFG_DEBUG_CMD_MSG
  XcpLight_self.cto_cmd_msg = *msg; // copy to internal state (for ext. debugging)
#endif

  bool send_flag = false;

  XcpLight_self.current_command = (msg->payload[0] & 0xFFu);

  if (XcpLight_self.current_command == XCP_CMD_CONNECT)
  {
    // STD : standard commands :: connect begin
    send_flag = cmdConnect(msg, reply_msg);
    // STD : standard commands :: connect end
  }
  else
  {
    if (XcpLight_self.session_status & XCP_SES_CONNECTED)
    {
      // in connected state process all other commands
      switch (XcpLight_self.current_command)
      {
        // STD : standard commands -> begin
        case XCP_CMD_DISCONNECT:
          send_flag = cmdDisconnect(msg, reply_msg);
          break;

        case XCP_CMD_GET_STATUS:
          send_flag = cmdGetStatus(msg, reply_msg);
          break;

        case XCP_CMD_SYNCH:
          send_flag = cmdSynch(msg, reply_msg);
          break;

        case XCP_CMD_GET_COMM_MODE_INFO:
          send_flag = cmdGetCommModeInfo(msg, reply_msg);
          break;

#ifdef XCPLIGHT_CFG_SEED_AND_KEY
        case XCP_CMD_GET_SEED:
          send_flag = cmdGetSeed(msg, reply_msg);
          break;

        case XCP_CMD_UNLOCK:
          send_flag = cmdUnlock(msg, reply_msg);
          break;
#endif // XCPLIGHT_CFG_SEED_AND_KEY

#ifdef XCPLIGHT_CFG_USER_CMD
        case XCP_CMD_USER_CMD:
          send_flag = cmdUserCmd(msg, reply_msg);
          break;
#endif // XCPLIGHT_CFG_USER_CMD

        case XCP_CMD_SET_MTA:
          send_flag = cmdSetMta(msg, reply_msg);
          break;

        case XCP_CMD_UPLOAD:
          send_flag = cmdUpload(msg, reply_msg);
          break;

        case XCP_CMD_SHORT_UPLOAD:
          send_flag = cmdShortUpload(msg, reply_msg);
          break;

        case XCP_CMD_BUILD_CHECKSUM:
          send_flag = buildErrorMessage(reply_msg, XCP_ERR_CMD_UNKNOWN);
          break;
        // STD : standard commands -> end

#ifdef XCPLIGHT_CFG_ENABLE_CALPAG
        // CAL : standard commands -> begin
        case XCP_CMD_DOWNLOAD:
          send_flag = cmdDownload(msg, reply_msg);
          break;
        // CAL : standard commands -> end

        // PAG: page switching commands -> begin
        case XCP_CMD_SET_CAL_PAGE:
        case XCP_CMD_GET_CAL_PAGE:
        // PAG: page switching commands -> end
#endif // XCPLIGHT_CFG_ENABLE_CALPAG

#ifdef XCPLIGHT_CFG_ENABLE_DAQ
        // DAQ: data acquisition commands -> begin
        // @note: not supported yet
        // DAQ: data acquisition commands -> end
#endif // XCPLIGHT_CFG_ENABLE_DAQ

#ifdef XCPLIGHT_CFG_ENABLE_PGM
        // PGM: programming commands -> begin
        // @note: not supported yet
        case XCP_CMD_PROGRAM_START:
        case XCP_CMD_PROGRAM_CLEAR:
        case XCP_CMD_PROGRAM:
        case XCP_CMD_PROGRAM_RESET:

        case XCP_CMD_PROGRAM_MAX:
        case XCP_CMD_PROGRAM_VERIFY:
          send_flag = buildErrorMessage(reply_msg, XCP_ERR_CMD_UNKNOWN);
          break;
        // PGM: programming commands -> end
#endif // XCPLIGHT_CFG_ENABLE_PGM

        // Whenever a command is unknown -> build and send an error message
        default:
          send_flag = buildErrorMessage(reply_msg, XCP_ERR_CMD_UNKNOWN);
          break;
      }
    }
    else
    {
      // no XCP communication in disconnected state! ignore command.
    }
  }

  // send reply message
  if (send_flag == true)
  {
    XcpLightCfg_sendMessage(reply_msg);
  }
}